

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::~HeapBucketT(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
               *this)

{
  uint uVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  undefined4 *puVar5;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar6;
  ulong uVar7;
  
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->heapBlockList,
             (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             ((this->super_HeapBucket).heapInfo)->recycler);
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,
             (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             ((this->super_HeapBucket).heapInfo)->recycler);
  if ((this->super_HeapBucket).heapBlockCount + (this->super_HeapBucket).newHeapBlockCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x69,"(this->heapBlockCount + this->newHeapBlockCount == 0)",
                       "this->heapBlockCount + this->newHeapBlockCount == 0");
    if (!bVar4) goto LAB_006cf506;
    *puVar5 = 0;
  }
  uVar1 = (this->super_HeapBucket).emptyHeapBlockCount;
  pSVar6 = this->emptyBlockList;
  if (pSVar6 == (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar3 = 1;
    do {
      uVar7 = uVar3;
      this_00 = (pSVar6->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
                super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar6 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&this_00->super_HeapBlock);
      uVar3 = uVar7 + 1;
    } while (pSVar6 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0
            );
  }
  if (uVar7 != uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x6b,
                       "(this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList))",
                       "this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList)");
    if (!bVar4) goto LAB_006cf506;
    *puVar5 = 0;
  }
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::DeleteEmptyHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->emptyBlockList,0);
  if ((this->super_HeapBucket).newHeapBlockCount + (this->super_HeapBucket).heapBlockCount +
      (this->super_HeapBucket).emptyHeapBlockCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x6e,
                       "(this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0)"
                       ,
                       "this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0"
                      );
    if (!bVar4) {
LAB_006cf506:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

HeapBucketT<TBlockType>::~HeapBucketT()
{
    DeleteHeapBlockList(this->heapBlockList);
    DeleteHeapBlockList(this->fullBlockList);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (allocableHeapBlockListHead != nullptr)
    {
        if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
        {
            FlushInterlockedSList(this->allocableHeapBlockListHead);
        }

        _aligned_free(this->allocableHeapBlockListHead);
    }

    DeleteHeapBlockList(this->sweepableHeapBlockList);
#endif
#endif

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(this->heapBlockCount + this->newHeapBlockCount == 0);
#endif
    RECYCLER_SLOW_CHECK(Assert(this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList)));
    DeleteEmptyHeapBlockList(this->emptyBlockList);
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    Assert(this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0);
#endif
}